

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

size_t __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
try_dequeue_bulk<__gnu_cxx::__normal_iterator<duckdb::BufferEvictionNode*,std::vector<duckdb::BufferEvictionNode,std::allocator<duckdb::BufferEvictionNode>>>>
          (ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
           *this,__normal_iterator<duckdb::BufferEvictionNode_*,_std::vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>_>
                 itemFirst,size_t max)

{
  ProducerBase *pPVar1;
  size_t sVar2;
  ProducerBase *this_00;
  size_t sVar3;
  __normal_iterator<duckdb::BufferEvictionNode_*,_std::vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>_>
  local_28;
  
  this_00 = *(ProducerBase **)this;
  sVar3 = 0;
  local_28._M_current = itemFirst._M_current;
  while( true ) {
    if (this_00 == (ProducerBase *)0x0) {
      return sVar3;
    }
    sVar2 = ProducerBase::
            dequeue_bulk<__gnu_cxx::__normal_iterator<duckdb::BufferEvictionNode*,std::vector<duckdb::BufferEvictionNode,std::allocator<duckdb::BufferEvictionNode>>>>
                      (this_00,&local_28,max - sVar3);
    sVar3 = sVar3 + sVar2;
    if (sVar3 == max) break;
    pPVar1 = this_00 + 8;
    this_00 = (ProducerBase *)(*(long *)pPVar1 + -8);
    if (*(long *)pPVar1 == 0) {
      this_00 = (ProducerBase *)0x0;
    }
  }
  return max;
}

Assistant:

size_t try_dequeue_bulk(It itemFirst, size_t max)
	{
		size_t count = 0;
		for (auto ptr = producerListTail.load(std::memory_order_acquire); ptr != nullptr; ptr = ptr->next_prod()) {
			count += ptr->dequeue_bulk(itemFirst, max - count);
			if (count == max) {
				break;
			}
		}
		return count;
	}